

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

EmbeddingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_embedding(NeuralNetworkLayer *this)

{
  bool bVar1;
  EmbeddingLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_embedding(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_embedding(this);
    this_00 = (EmbeddingLayerParams *)operator_new(0x38);
    EmbeddingLayerParams::EmbeddingLayerParams(this_00);
    (this->layer_).embedding_ = this_00;
  }
  return (EmbeddingLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::EmbeddingLayerParams* NeuralNetworkLayer::mutable_embedding() {
  if (!has_embedding()) {
    clear_layer();
    set_has_embedding();
    layer_.embedding_ = new ::CoreML::Specification::EmbeddingLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.embedding)
  return layer_.embedding_;
}